

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred,uint16_t *out)

{
  SSL *ssl_00;
  bool bVar1;
  pointer peVar2;
  iterator puVar3;
  iterator __last;
  unsigned_short *puVar4;
  uint16_t local_a2;
  iterator puStack_a0;
  uint16_t sigalg;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *__range1;
  Span<const_unsigned_short> sigalgs;
  unsigned_short *local_70;
  unsigned_short *local_68;
  unsigned_short *local_60;
  unsigned_short *local_58;
  unsigned_short *local_50;
  undefined1 local_48 [8];
  Span<const_unsigned_short> peer_sigalgs;
  uint16_t version;
  SSL *ssl;
  uint16_t *out_local;
  SSL_CREDENTIAL *cred_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  bVar1 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar1) {
    peer_sigalgs.size_._6_2_ = ssl_protocol_version(ssl_00);
    if (peer_sigalgs.size_._6_2_ < 0x303) {
      peVar2 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&cred->pubkey);
      bVar1 = tls1_get_legacy_signature_algorithm(out,peVar2);
      if (bVar1) {
        hs_local._7_1_ = true;
      }
      else {
        ERR_put_error(0x10,0,0xfd,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x11ae);
        hs_local._7_1_ = false;
      }
    }
    else {
      Span<const_unsigned_short>::Span((Span<const_unsigned_short> *)local_48);
      if (cred->type == kDelegated) {
        Span<unsigned_short_const>::
        Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
                  ((Span<unsigned_short_const> *)&local_58,&hs->peer_delegated_credential_sigalgs);
        local_48 = (undefined1  [8])local_58;
        peer_sigalgs.data_ = local_50;
      }
      else {
        Span<unsigned_short_const>::
        Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
                  ((Span<unsigned_short_const> *)&local_68,&hs->peer_sigalgs);
        local_48 = (undefined1  [8])local_68;
        peer_sigalgs.data_ = local_60;
        bVar1 = Span<const_unsigned_short>::empty((Span<const_unsigned_short> *)local_48);
        if ((bVar1) && (peer_sigalgs.size_._6_2_ == 0x303)) {
          Span<unsigned_short_const>::Span<2ul>
                    ((Span<unsigned_short_const> *)&sigalgs.size_,
                     (unsigned_short (*) [2])tls1_choose_signature_algorithm::kTLS12Default);
          local_48 = (undefined1  [8])sigalgs.size_;
          peer_sigalgs.data_ = local_70;
        }
      }
      bVar1 = Array<unsigned_short>::empty(&cred->sigalgs);
      if (bVar1) {
        Span<unsigned_short_const>::Span<12ul>
                  ((Span<unsigned_short_const> *)&__range1,
                   (unsigned_short (*) [12])kSignSignatureAlgorithms);
      }
      else {
        Span<unsigned_short_const>::
        Span<bssl::Array<unsigned_short>,void,bssl::Array<unsigned_short>>
                  ((Span<unsigned_short_const> *)&__range1,&cred->sigalgs);
      }
      __begin1 = (iterator)&__range1;
      __end1 = Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)__begin1);
      puStack_a0 = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)__begin1);
      for (; __end1 != puStack_a0; __end1 = __end1 + 1) {
        local_a2 = *__end1;
        peVar2 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&cred->pubkey);
        bVar1 = ssl_pkey_supports_algorithm(ssl_00,peVar2,local_a2,false);
        if (bVar1) {
          puVar3 = Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)local_48);
          __last = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)local_48);
          puVar4 = std::find<unsigned_short_const*,unsigned_short>(puVar3,__last,&local_a2);
          puVar3 = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)local_48);
          if (puVar4 != puVar3) {
            *out = local_a2;
            return true;
          }
        }
      }
      ERR_put_error(0x10,0,0xfd,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x11d2);
      hs_local._7_1_ = false;
    }
  }
  else {
    ERR_put_error(0x10,0,0xe4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x11a5);
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool tls1_choose_signature_algorithm(SSL_HANDSHAKE *hs,
                                     const SSL_CREDENTIAL *cred,
                                     uint16_t *out) {
  SSL *const ssl = hs->ssl;
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
    return false;
  }

  // Before TLS 1.2, the signature algorithm isn't negotiated as part of the
  // handshake.
  uint16_t version = ssl_protocol_version(ssl);
  if (version < TLS1_2_VERSION) {
    if (!tls1_get_legacy_signature_algorithm(out, cred->pubkey.get())) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
      return false;
    }
    return true;
  }

  Span<const uint16_t> peer_sigalgs;
  if (cred->type == SSLCredentialType::kDelegated) {
    peer_sigalgs = hs->peer_delegated_credential_sigalgs;
  } else {
    peer_sigalgs = hs->peer_sigalgs;
    if (peer_sigalgs.empty() && version == TLS1_2_VERSION) {
      // If the client didn't specify any signature_algorithms extension, it is
      // interpreted as SHA-1. See
      // http://tools.ietf.org/html/rfc5246#section-7.4.1.4.1
      static const uint16_t kTLS12Default[] = {SSL_SIGN_RSA_PKCS1_SHA1,
                                               SSL_SIGN_ECDSA_SHA1};
      peer_sigalgs = kTLS12Default;
    }
  }

  Span<const uint16_t> sigalgs =
      cred->sigalgs.empty() ? Span(kSignSignatureAlgorithms) : cred->sigalgs;
  for (uint16_t sigalg : sigalgs) {
    if (!ssl_pkey_supports_algorithm(ssl, cred->pubkey.get(), sigalg,
                                     /*is_verify=*/false)) {
      continue;
    }

    if (std::find(peer_sigalgs.begin(), peer_sigalgs.end(), sigalg) !=
        peer_sigalgs.end()) {
      *out = sigalg;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
  return false;
}